

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxMultiAssign::Emit(FxMultiAssign *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  ExpEmit EVar2;
  ulong uVar3;
  undefined4 extraout_var;
  
  (*this->Right->_vptr_FxExpression[9])();
  if ((this->Base).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) {
    uVar3 = 0;
    do {
      FxLocalVariableDeclaration::SetReg
                ((this->LocalVarContainer->LocalVars).Array[uVar3],
                 *(ExpEmit *)(this->Right[2].ScriptPosition.FileName.Chars + uVar3 * 8));
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->Base).super_TArray<FxExpression_*,_FxExpression_*>.Count);
  }
  pFVar1 = this->Right;
  if (*(int *)&pFVar1[2].ScriptPosition.field_0xc != 0) {
    *(undefined4 *)&pFVar1[2].ScriptPosition.field_0xc = 0;
  }
  TArray<ExpEmit,_ExpEmit>::ShrinkToFit((TArray<ExpEmit,_ExpEmit> *)&pFVar1[2].ScriptPosition);
  EVar2._0_4_ = (*(this->LocalVarContainer->super_FxSequence).super_FxExpression._vptr_FxExpression
                  [9])(this->LocalVarContainer,build);
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  return EVar2;
}

Assistant:

ExpEmit FxMultiAssign::Emit(VMFunctionBuilder *build)
{
	Right->Emit(build);
	for (unsigned i = 0; i < Base.Size(); i++)
	{
		LocalVarContainer->LocalVars[i]->SetReg(static_cast<FxVMFunctionCall *>(Right)->ReturnRegs[i]);
	}
	static_cast<FxVMFunctionCall *>(Right)->ReturnRegs.Clear();
	static_cast<FxVMFunctionCall *>(Right)->ReturnRegs.ShrinkToFit();
	return LocalVarContainer->Emit(build);
}